

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereUsablePartialIndex(int iTab,u8 jointype,WhereClause *pWC,Expr *pWhere)

{
  sqlite3 *pE1;
  int iVar1;
  Expr *pExpr;
  Parse *pParse;
  WhereTerm *pTerm;
  Expr *pEStack_28;
  int i;
  Expr *pWhere_local;
  WhereClause *pWC_local;
  u8 jointype_local;
  int iTab_local;
  
  if ((jointype & 0x40) == 0) {
    pExpr = (Expr *)pWC->pWInfo->pParse;
    for (pEStack_28 = pWhere; pEStack_28->op == ','; pEStack_28 = pEStack_28->pRight) {
      iVar1 = whereUsablePartialIndex(iTab,jointype,pWC,pEStack_28->pLeft);
      if (iVar1 == 0) {
        return 0;
      }
    }
    if ((((Parse *)pExpr)->db->flags & 0x800000) != 0) {
      pExpr = (Expr *)0x0;
    }
    pTerm._4_4_ = 0;
    pParse = (Parse *)pWC->a;
    for (; pTerm._4_4_ < pWC->nTerm; pTerm._4_4_ = pTerm._4_4_ + 1) {
      pE1 = pParse->db;
      if ((((((ulong)pE1->pVfs & 0x100000000) == 0) ||
           (((anon_union_4_2_009eaf8f_for_w *)((long)&pE1->flags + 4))->iJoin == iTab)) &&
          (((jointype & 0x20) == 0 || (((ulong)pE1->pVfs & 0x100000000) != 0)))) &&
         ((iVar1 = sqlite3ExprImpliesExpr((Parse *)pExpr,(Expr *)pE1,pEStack_28,iTab), iVar1 != 0 &&
          (((ulong)pParse->pVdbe & 0x800000) == 0)))) {
        return 1;
      }
      pParse = (Parse *)&pParse->nMem;
    }
  }
  return 0;
}

Assistant:

static int whereUsablePartialIndex(
  int iTab,             /* The table for which we want an index */
  u8 jointype,          /* The JT_* flags on the join */
  WhereClause *pWC,     /* The WHERE clause of the query */
  Expr *pWhere          /* The WHERE clause from the partial index */
){
  int i;
  WhereTerm *pTerm;
  Parse *pParse;

  if( jointype & JT_LTORJ ) return 0;
  pParse = pWC->pWInfo->pParse;
  while( pWhere->op==TK_AND ){
    if( !whereUsablePartialIndex(iTab,jointype,pWC,pWhere->pLeft) ) return 0;
    pWhere = pWhere->pRight;
  }
  if( pParse->db->flags & SQLITE_EnableQPSG ) pParse = 0;
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr;
    pExpr = pTerm->pExpr;
    if( (!ExprHasProperty(pExpr, EP_OuterON) || pExpr->w.iJoin==iTab)
     && ((jointype & JT_OUTER)==0 || ExprHasProperty(pExpr, EP_OuterON))
     && sqlite3ExprImpliesExpr(pParse, pExpr, pWhere, iTab)
     && (pTerm->wtFlags & TERM_VNULL)==0
    ){
      return 1;
    }
  }
  return 0;
}